

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O3

void __thiscall
QRasterPaintEnginePrivate::rasterize
          (QRasterPaintEnginePrivate *this,QT_FT_Outline *outline,ProcessSpans callback,
          void *userData,QRasterBuffer *param_4)

{
  undefined4 uVar1;
  undefined4 uVar2;
  QPaintEngineState *pQVar3;
  int iVar4;
  int iVar5;
  QPaintEngineState *pQVar6;
  int iVar7;
  void *__ptr;
  long in_FS_OFFSET;
  uchar rasterPoolOnStack [8207];
  QT_FT_Raster_Params local_20a0;
  char local_2048 [8208];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (outline != (QT_FT_Outline *)0x0 && callback != (ProcessSpans)0x0) {
    pQVar3 = ((this->super_QPaintEngineExPrivate).super_QPaintEnginePrivate.q_ptr)->state;
    pQVar6 = pQVar3 + -2;
    if (pQVar3 == (QPaintEngineState *)0x0) {
      pQVar6 = (QPaintEngineState *)0x0;
    }
    if ((pQVar6[0x105].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
         super_QFlagsStorage<QPaintEngine::DirtyFlag>.i & 8) == 0) {
      QRasterizer::setAntialiased((this->rasterizer).d,false);
      QRasterizer::setClipRect((this->rasterizer).d,&this->deviceRect);
      QRasterizer::initialize((this->rasterizer).d,callback,userData);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QRasterizer::rasterize((this->rasterizer).d,outline,(uint)(outline->flags == 0));
        return;
      }
      goto LAB_003b9877;
    }
    gray_raster_reset(*(this->grayRaster).d,local_2048,0x2000);
    iVar7 = 0;
    local_20a0.target = (QT_FT_Bitmap *)0x0;
    local_20a0.black_spans = (QT_FT_SpanFunc)0x0;
    local_20a0.bit_test = (QT_FT_Raster_BitTest_Func)0x0;
    local_20a0.bit_set = (QT_FT_Raster_BitSet_Func)0x0;
    local_20a0.clip_box.xMin = (this->deviceRect).x1.m_i;
    local_20a0.clip_box.yMin = (this->deviceRect).y1.m_i;
    uVar1 = (this->deviceRect).x2;
    uVar2 = (this->deviceRect).y2;
    local_20a0.clip_box.xMax = uVar1 + 1;
    local_20a0.clip_box.yMax = uVar2 + 1;
    local_20a0._16_8_ = 0xaaaaaaaa00000007;
    local_20a0.skip_spans = 0;
    local_20a0._84_4_ = 0xaaaaaaaa;
    local_20a0.source = outline;
    local_20a0.gray_spans = callback;
    local_20a0.user = userData;
    iVar4 = gray_raster_render(*(this->grayRaster).d,&local_20a0);
    __ptr = (void *)0x0;
    if (iVar4 == -6) {
      __ptr = (void *)0x0;
      iVar4 = 0x2000;
      do {
        if (0x80000 < iVar4) {
          rasterize();
          break;
        }
        iVar5 = q_gray_rendered_spans(*(this->grayRaster).d);
        iVar7 = iVar7 + iVar5;
        free(__ptr);
        __ptr = malloc((long)(iVar4 * 2 + 0xf));
        gray_raster_done(*(this->grayRaster).d);
        gray_raster_new((this->grayRaster).d);
        gray_raster_reset(*(this->grayRaster).d,(char *)((long)__ptr + 0xfU & 0xfffffffffffffff0),
                          (long)(iVar4 * 2));
        local_20a0._16_8_ = local_20a0._16_8_ | 3;
        local_20a0.skip_spans = iVar7;
        local_20a0.gray_spans = callback;
        iVar5 = gray_raster_render(*(this->grayRaster).d,&local_20a0);
        iVar4 = iVar4 * 2;
      } while (iVar5 == -6);
    }
    free(__ptr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_003b9877:
  __stack_chk_fail();
}

Assistant:

void QRasterPaintEnginePrivate::rasterize(QT_FT_Outline *outline,
                                          ProcessSpans callback,
                                          void *userData, QRasterBuffer *)
{
    if (!callback || !outline)
        return;

    Q_Q(QRasterPaintEngine);
    QRasterPaintEngineState *s = q->state();

    if (!s->flags.antialiased) {
        rasterizer->setAntialiased(s->flags.antialiased);
        rasterizer->setClipRect(deviceRect);
        rasterizer->initialize(callback, userData);

        const Qt::FillRule fillRule = outline->flags == QT_FT_OUTLINE_NONE
                                      ? Qt::WindingFill
                                      : Qt::OddEvenFill;

        rasterizer->rasterize(outline, fillRule);
        return;
    }

    // Initial size for raster pool is MINIMUM_POOL_SIZE so as to
    // minimize memory reallocations. However if initial size for
    // raster pool is changed for lower value, reallocations will
    // occur normally.
    int rasterPoolSize = MINIMUM_POOL_SIZE;
    Q_DECL_UNINITIALIZED uchar rasterPoolOnStack[MINIMUM_POOL_SIZE + 0xf];
    uchar *rasterPoolBase = alignAddress(rasterPoolOnStack, 0xf);
    uchar *rasterPoolOnHeap = nullptr;

    qt_ft_grays_raster.raster_reset(*grayRaster.data(), rasterPoolBase, rasterPoolSize);

    void *data = userData;

    QT_FT_BBox clip_box = { deviceRect.x(),
                            deviceRect.y(),
                            deviceRect.x() + deviceRect.width(),
                            deviceRect.y() + deviceRect.height() };

    QT_FT_Raster_Params rasterParams;
    rasterParams.target = nullptr;
    rasterParams.source = outline;
    rasterParams.flags = QT_FT_RASTER_FLAG_CLIP;
    rasterParams.gray_spans = nullptr;
    rasterParams.black_spans = nullptr;
    rasterParams.bit_test = nullptr;
    rasterParams.bit_set = nullptr;
    rasterParams.user = data;
    rasterParams.clip_box = clip_box;

    bool done = false;
    int error;

    int rendered_spans = 0;

    while (!done) {

        rasterParams.flags |= (QT_FT_RASTER_FLAG_AA | QT_FT_RASTER_FLAG_DIRECT);
        rasterParams.gray_spans = callback;
        rasterParams.skip_spans = rendered_spans;
        error = qt_ft_grays_raster.raster_render(*grayRaster.data(), &rasterParams);

        // Out of memory, reallocate some more and try again...
        if (error == -6) { // ErrRaster_OutOfMemory from qgrayraster.c
            rasterPoolSize *= 2;
            if (rasterPoolSize > 1024 * 1024) {
                qWarning("QPainter: Rasterization of primitive failed");
                break;
            }

            rendered_spans += q_gray_rendered_spans(*grayRaster.data());

            free(rasterPoolOnHeap);
            rasterPoolOnHeap = (uchar *)malloc(rasterPoolSize + 0xf);

            Q_CHECK_PTR(rasterPoolOnHeap); // note: we just freed the old rasterPoolBase. I hope it's not fatal.

            rasterPoolBase = alignAddress(rasterPoolOnHeap, 0xf);

            qt_ft_grays_raster.raster_done(*grayRaster.data());
            qt_ft_grays_raster.raster_new(grayRaster.data());
            qt_ft_grays_raster.raster_reset(*grayRaster.data(), rasterPoolBase, rasterPoolSize);
        } else {
            done = true;
        }
    }

    free(rasterPoolOnHeap);
}